

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Compiler::make_constant_null(Compiler *this,uint32_t id,uint32_t type)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  SPIRType *constant_type_;
  SPIRConstant *pSVar4;
  uint32_t i;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  bool local_79;
  uint32_t type_local;
  uint local_74;
  uint *local_70;
  SmallVector<unsigned_int,_8UL> elements;
  
  type_local = type;
  constant_type_ = get<diligent_spirv_cross::SPIRType>(this,type);
  if (constant_type_->pointer == true) {
LAB_002cbadb:
    pSVar4 = set<diligent_spirv_cross::SPIRConstant,unsigned_int&>(this,id,&type_local);
    SPIRConstant::make_null(pSVar4,constant_type_);
  }
  else {
    if ((constant_type_->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      sVar7 = (constant_type_->member_types).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
              buffer_size;
      if (sVar7 == 0) goto LAB_002cbadb;
      uVar2 = ParsedIR::increase_bound_by(&this->ir,(uint32_t)sVar7);
      SmallVector<unsigned_int,_8UL>::SmallVector
                (&elements,
                 (constant_type_->member_types).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
                 buffer_size);
      for (uVar3 = 0; uVar6 = (ulong)uVar3,
          uVar6 < (constant_type_->member_types).
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
                  buffer_size; uVar3 = uVar3 + 1) {
        make_constant_null(this,uVar2 + uVar3,
                           (constant_type_->member_types).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                           .ptr[uVar6].id);
        elements.super_VectorView<unsigned_int>.ptr[uVar6] = uVar2 + uVar3;
      }
      local_70 = elements.super_VectorView<unsigned_int>.ptr;
      local_74 = (uint)elements.super_VectorView<unsigned_int>.buffer_size;
      local_79 = false;
      set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                (this,id,&type_local,&local_70,&local_74,&local_79);
    }
    else {
      if ((constant_type_->parent_type).id == 0) {
        __assert_fail("constant_type.parent_type",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                      ,0x132e,
                      "void diligent_spirv_cross::Compiler::make_constant_null(uint32_t, uint32_t)")
        ;
      }
      uVar2 = ParsedIR::increase_bound_by(&this->ir,1);
      make_constant_null(this,uVar2,(constant_type_->parent_type).id);
      bVar1 = (constant_type_->array_size_literal).super_VectorView<bool>.ptr
              [(constant_type_->array_size_literal).super_VectorView<bool>.buffer_size - 1];
      if (bVar1 == true) {
        sVar7 = (size_t)(constant_type_->array).super_VectorView<unsigned_int>.ptr
                        [(constant_type_->array).super_VectorView<unsigned_int>.buffer_size - 1];
      }
      else {
        sVar7 = 1;
      }
      SmallVector<unsigned_int,_8UL>::SmallVector(&elements,sVar7);
      for (sVar5 = 0; sVar7 != sVar5; sVar5 = sVar5 + 1) {
        elements.super_VectorView<unsigned_int>.ptr[sVar5] = uVar2;
      }
      local_70 = elements.super_VectorView<unsigned_int>.ptr;
      local_74 = (uint)elements.super_VectorView<unsigned_int>.buffer_size;
      local_79 = false;
      pSVar4 = set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                         (this,id,&type_local,&local_70,&local_74,&local_79);
      pSVar4->is_null_array_specialized_length = (bool)(bVar1 ^ 1);
    }
    SmallVector<unsigned_int,_8UL>::~SmallVector(&elements);
  }
  return;
}

Assistant:

void Compiler::make_constant_null(uint32_t id, uint32_t type)
{
	auto &constant_type = get<SPIRType>(type);

	if (constant_type.pointer)
	{
		auto &constant = set<SPIRConstant>(id, type);
		constant.make_null(constant_type);
	}
	else if (!constant_type.array.empty())
	{
		assert(constant_type.parent_type);
		uint32_t parent_id = ir.increase_bound_by(1);
		make_constant_null(parent_id, constant_type.parent_type);

		// The array size of OpConstantNull can be either literal or specialization constant.
		// In the latter case, we cannot take the value as-is, as it can be changed to anything.
		// Rather, we assume it to be *one* for the sake of initializer.
		bool is_literal_array_size = constant_type.array_size_literal.back();
		uint32_t count = is_literal_array_size ? constant_type.array.back() : 1;
		SmallVector<uint32_t> elements(count);
		for (uint32_t i = 0; i < count; i++)
			elements[i] = parent_id;
		auto &constant = set<SPIRConstant>(id, type, elements.data(), uint32_t(elements.size()), false);
		constant.is_null_array_specialized_length = !is_literal_array_size;
	}
	else if (!constant_type.member_types.empty())
	{
		uint32_t member_ids = ir.increase_bound_by(uint32_t(constant_type.member_types.size()));
		SmallVector<uint32_t> elements(constant_type.member_types.size());
		for (uint32_t i = 0; i < constant_type.member_types.size(); i++)
		{
			make_constant_null(member_ids + i, constant_type.member_types[i]);
			elements[i] = member_ids + i;
		}
		set<SPIRConstant>(id, type, elements.data(), uint32_t(elements.size()), false);
	}
	else
	{
		auto &constant = set<SPIRConstant>(id, type);
		constant.make_null(constant_type);
	}
}